

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O3

bool QXmlUtils::rangeContains(RangeIter begin,RangeIter end,QChar c)

{
  RangeIter pQVar1;
  RangeIter pQVar2;
  long lVar3;
  RangeIter pQVar4;
  
  pQVar2 = begin;
  if ((ushort)c.ucs <= begin->max) {
LAB_002ff29f:
    return pQVar2->min <= (ushort)c.ucs;
  }
  pQVar2 = begin + 1;
  if (pQVar2 != end) {
    if ((ushort)c.ucs <= begin[1].max) goto LAB_002ff29f;
    do {
      if (pQVar2 == end) {
        return false;
      }
      lVar3 = (long)end - (long)pQVar2 >> 2;
      pQVar1 = (RangeIter)
               (&pQVar2->min + (lVar3 - ((long)end - (long)pQVar2 >> 0x3f) & 0xfffffffffffffffe));
      pQVar4 = pQVar1;
      if ((pQVar1->min <= (ushort)c.ucs) &&
         (pQVar4 = end, pQVar2 = pQVar1, (ushort)c.ucs <= pQVar1->max)) {
        return true;
      }
      end = pQVar4;
    } while (2 < lVar3 + 1U);
  }
  return false;
}

Assistant:

bool QXmlUtils::rangeContains(RangeIter begin, RangeIter end, const QChar c)
{
    const ushort cp(c.unicode());

    // check the first two ranges "manually" as characters in that
    // range are checked very often and we avoid the binary search below.

    if (cp <= begin->max)
        return cp >= begin->min;

    ++begin;

    if (begin == end)
        return false;

    if (cp <= begin->max)
        return cp >= begin->min;

    while (begin != end) {
        qptrdiff delta = (end - begin) / 2;
        RangeIter mid = begin + delta;

        if (mid->min > cp)
            end = mid;
        else if (mid->max < cp)
            begin = mid;
        else
            return true;

        if (delta == 0)
            break;
    }

    return false;
}